

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bin.cpp
# Opt level: O2

void SolveFile(string *file)

{
  char cVar1;
  long lVar2;
  pointer pCVar3;
  pointer pCVar4;
  Field *pFVar5;
  ostream *poVar6;
  ulong uVar7;
  Field *pFVar8;
  pointer pCVar9;
  ulong uVar10;
  __normal_iterator<Class_*,_std::vector<Class,_std::allocator<Class>_>_> __i;
  long lVar11;
  string remainingFile;
  string finalFile;
  string local_400 [32];
  Class *local_3e0;
  Class *local_3d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  ClassBundle cb;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  string content;
  string fileContent;
  string local_310 [32];
  string local_2f0 [32];
  Field *local_2d0;
  Field *local_2c8;
  ofstream fout;
  string local_290 [480];
  Class local_b0;
  
  ReadFromFile(&content,file);
  EraseComments((string *)&fout,&content);
  std::__cxx11::string::operator=((string *)&content,(string *)&fout);
  std::__cxx11::string::~string((string *)&fout);
  GetWords(&words,&content);
  ParseClasses(&cb,&words);
  ClassBundle::upgradeScopes(&cb);
  std::operator<<((ostream *)&std::cout,"+-+-+-+-+-+-+-+-+-+-+-+-+-+\n");
  std::operator<<((ostream *)&std::cout,"Found the following classes\n");
  local_3e0 = cb.allClasses.super__Vector_base<Class,_std::allocator<Class>_>._M_impl.
              super__Vector_impl_data._M_finish;
  pCVar9 = cb.allClasses.super__Vector_base<Class,_std::allocator<Class>_>._M_impl.
           super__Vector_impl_data._M_start;
  while (pCVar4 = cb.allClasses.super__Vector_base<Class,_std::allocator<Class>_>._M_impl.
                  super__Vector_impl_data._M_finish,
        pCVar3 = cb.allClasses.super__Vector_base<Class,_std::allocator<Class>_>._M_impl.
                 super__Vector_impl_data._M_start, pCVar9 != local_3e0) {
    local_3d8 = pCVar9;
    Class::Class((Class *)&fout,pCVar9);
    std::__cxx11::string::string((string *)&remainingFile,local_290);
    Class::Class((Class *)&fileContent,(Class *)&fout);
    poVar6 = std::operator<<((ostream *)&std::cout,"Name:\t");
    poVar6 = std::operator<<(poVar6,local_2f0);
    std::operator<<(poVar6,'\n');
    poVar6 = std::operator<<((ostream *)&std::cout,"Scope:\t");
    poVar6 = std::operator<<(poVar6,local_310);
    std::operator<<(poVar6,'\n');
    std::operator<<((ostream *)&std::cout,"~~~~~~~\n");
    pFVar5 = local_2c8;
    for (pFVar8 = local_2d0; pFVar8 != pFVar5; pFVar8 = pFVar8 + 1) {
      Field::Field((Field *)&finalFile,pFVar8);
      poVar6 = std::operator<<((ostream *)&std::cout,"\t");
      poVar6 = std::operator<<(poVar6,(string *)&finalFile);
      poVar6 = std::operator<<(poVar6,'\t');
      poVar6 = std::operator<<(poVar6,local_400);
      std::operator<<(poVar6,'\n');
      Field::~Field((Field *)&finalFile);
    }
    std::operator<<((ostream *)&std::cout,"<--------->\n\n\n");
    Class::~Class((Class *)&fileContent);
    std::__cxx11::string::~string((string *)&remainingFile);
    Class::~Class((Class *)&fout);
    pCVar9 = local_3d8 + 1;
  }
  if (cb.allClasses.super__Vector_base<Class,_std::allocator<Class>_>._M_impl.
      super__Vector_impl_data._M_start !=
      cb.allClasses.super__Vector_base<Class,_std::allocator<Class>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    lVar11 = (long)cb.allClasses.super__Vector_base<Class,_std::allocator<Class>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)cb.allClasses.super__Vector_base<Class,_std::allocator<Class>_>._M_impl.
                   super__Vector_impl_data._M_start;
    uVar7 = lVar11 >> 7;
    lVar2 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Class*,std::vector<Class,std::allocator<Class>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<SolveFile(std::__cxx11::string_const&)::__0>>
              (cb.allClasses.super__Vector_base<Class,_std::allocator<Class>_>._M_impl.
               super__Vector_impl_data._M_start,
               cb.allClasses.super__Vector_base<Class,_std::allocator<Class>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar11 < 0x801) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<Class*,std::vector<Class,std::allocator<Class>>>,__gnu_cxx::__ops::_Iter_comp_iter<SolveFile(std::__cxx11::string_const&)::__0>>
                (pCVar3,pCVar4);
    }
    else {
      pCVar9 = pCVar3 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<Class*,std::vector<Class,std::allocator<Class>>>,__gnu_cxx::__ops::_Iter_comp_iter<SolveFile(std::__cxx11::string_const&)::__0>>
                (pCVar3,pCVar9);
      for (; pCVar9 != pCVar4; pCVar9 = pCVar9 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<Class*,std::vector<Class,std::allocator<Class>>>,__gnu_cxx::__ops::_Val_comp_iter<SolveFile(std::__cxx11::string_const&)::__0>>
                  (pCVar9);
      }
    }
  }
  std::__cxx11::string::string((string *)&fileContent,"",(allocator *)&fout);
  std::__cxx11::string::string((string *)&fout,(string *)file);
  uVar7 = 0;
  uVar10 = 0;
  if (0 < (int)file->_M_string_length) {
    uVar10 = file->_M_string_length & 0xffffffff;
  }
  for (; uVar10 != uVar7; uVar7 = uVar7 + 1) {
  }
  std::__cxx11::string::substr((ulong)&local_370,(ulong)file);
  std::operator+(&remainingFile,"#include \"",&local_370);
  std::operator+(&finalFile,&remainingFile,"\"\n#include <JSON>\n\n");
  std::__cxx11::string::append((string *)&fileContent);
  std::__cxx11::string::~string((string *)&finalFile);
  std::__cxx11::string::~string((string *)&remainingFile);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&fout);
  for (; cb.allClasses.super__Vector_base<Class,_std::allocator<Class>_>._M_impl.
         super__Vector_impl_data._M_start !=
         cb.allClasses.super__Vector_base<Class,_std::allocator<Class>_>._M_impl.
         super__Vector_impl_data._M_finish;
      cb.allClasses.super__Vector_base<Class,_std::allocator<Class>_>._M_impl.
      super__Vector_impl_data._M_start =
           cb.allClasses.super__Vector_base<Class,_std::allocator<Class>_>._M_impl.
           super__Vector_impl_data._M_start + 1) {
    Class::Class((Class *)&fout,
                 cb.allClasses.super__Vector_base<Class,_std::allocator<Class>_>._M_impl.
                 super__Vector_impl_data._M_start);
    Class::Class(&local_b0,(Class *)&fout);
    JSONifyClass_abi_cxx11_(&finalFile,&local_b0);
    std::__cxx11::string::append((string *)&fileContent);
    std::__cxx11::string::~string((string *)&finalFile);
    Class::~Class(&local_b0);
    Class::~Class((Class *)&fout);
  }
  std::__cxx11::string::string((string *)&finalFile,(string *)file);
  std::__cxx11::string::string((string *)&remainingFile,"",(allocator *)&fout);
  do {
    if (finalFile._M_string_length == 0) break;
    std::__cxx11::string::push_back((char)&remainingFile);
    cVar1 = finalFile._M_dataplus._M_p[finalFile._M_string_length - 1];
    std::__cxx11::string::pop_back();
  } while (cVar1 != '.');
  std::__cxx11::string::append((char *)&finalFile);
  std::__reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (remainingFile._M_dataplus._M_p,
             remainingFile._M_dataplus._M_p + remainingFile._M_string_length);
  std::__cxx11::string::append((string *)&finalFile);
  std::ofstream::ofstream(&fout,(string *)&finalFile,_S_out);
  poVar6 = std::operator<<((ostream *)&fout,(string *)&fileContent);
  std::operator<<(poVar6,'\n');
  std::ofstream::close();
  std::ofstream::~ofstream(&fout);
  std::__cxx11::string::~string((string *)&remainingFile);
  std::__cxx11::string::~string((string *)&finalFile);
  std::__cxx11::string::~string((string *)&fileContent);
  ClassBundle::~ClassBundle(&cb);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&words);
  std::__cxx11::string::~string((string *)&content);
  return;
}

Assistant:

void SolveFile(const string& file) {
    auto content = ReadFromFile(file);
/*
    cerr << "~~~~~~~~~~~~~~~~~~~~~~\n";
    cerr << EraseComments(content) << '\n';
    cerr << "~~~~~~~~~~~~~~~~~~~~~~\n";
    cerr << "\n\n\n\n\n\n\n";
*/
    content = EraseComments(content);
    auto words = GetWords(content);
    ClassBundle cb = ParseClasses(words);

    cb.upgradeScopes();

    cout << "+-+-+-+-+-+-+-+-+-+-+-+-+-+\n";
    cout << "Found the following classes\n";
    for (auto itr : cb.allClasses) {
        auto scope = itr.scope;
        auto cls = itr;
        cout << "Name:\t" << cls.name << '\n';
        cout << "Scope:\t" << cls.scope << '\n';
        cout << "~~~~~~~\n";
        for (auto itr : cls.fields) {
            cout << "\t" << itr.type << '\t' << itr.name << '\n';
        }
        cout << "<--------->\n\n\n";
    }

    sort(cb.allClasses.begin(), cb.allClasses.end(), [](const auto& a, const auto& b) { return a.scope.size() > b.scope.size(); });
    string fileContent = "";

    {
        std::string shortFile = file;
        int start = 0;

        for (int i = 0; i < (int)file.size(); i += 1) {
            if (file[i] == '/') {
                start = i;
            }
        }

        fileContent += "#include \"" + file.substr(start, file.size()) + "\"\n"
                        "#include <JSON>\n\n";
    }

    for (auto itr : cb.allClasses) {
        fileContent += JSONifyClass(itr);
    }

    string finalFile = file;
    string remainingFile = "";

    while (finalFile.size()) {
        remainingFile += finalFile.back();
        if (finalFile.back() == '.') {
            finalFile.pop_back();
            break;
        }

        finalFile.pop_back();
    }

    finalFile += "JSONImpl";
    reverse(remainingFile.begin(), remainingFile.end());
    finalFile += remainingFile;

    ofstream fout(finalFile);
    fout << fileContent << '\n';
    fout.close();
}